

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiveTraffic.h
# Opt level: O3

string * strAtMost(string *__return_storage_ptr__,string *s,size_t m)

{
  ulong uVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  size_type *psVar5;
  long *local_30 [2];
  long local_20 [2];
  
  uVar1 = s->_M_string_length;
  if (m < uVar1) {
    std::__cxx11::string::substr((ulong)local_30,(ulong)s);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_30);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      lVar3 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string strAtMost(const std::string s, size_t m) {
    return s.length() <= m ? s :
    s.substr(0, m-3) + "...";
}